

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

int ctemplate::TemplateDictionary::StringAppendV
              (char *space,char **out,char *format,__va_list_tag *ap)

{
  char *__s;
  ulong uVar1;
  char *buf;
  int length;
  int result;
  va_list backup_ap;
  int kBufsize;
  __va_list_tag *ap_local;
  char *format_local;
  char **out_local;
  char *space_local;
  
  backup_ap[0].overflow_arg_area = ap->reg_save_area;
  length = ap->gp_offset;
  unique0x100000c4 = ap->fp_offset;
  backup_ap[0]._0_8_ = ap->overflow_arg_area;
  buf._4_4_ = vsnprintf(space,0x400,format,&length);
  if ((buf._4_4_ < 0) || (0x3ff < buf._4_4_)) {
    buf._0_4_ = 0x400;
    while( true ) {
      if (buf._4_4_ < 0) {
        buf._0_4_ = (int)buf << 1;
      }
      else {
        buf._0_4_ = buf._4_4_ + 1;
      }
      uVar1 = (ulong)(int)buf;
      if ((long)uVar1 < 0) {
        uVar1 = 0xffffffffffffffff;
      }
      __s = (char *)operator_new__(uVar1);
      backup_ap[0].overflow_arg_area = ap->reg_save_area;
      length = ap->gp_offset;
      unique0x100000e4 = ap->fp_offset;
      backup_ap[0]._0_8_ = ap->overflow_arg_area;
      buf._4_4_ = vsnprintf(__s,(long)(int)buf,format,&length);
      if ((-1 < buf._4_4_) && (buf._4_4_ < (int)buf)) break;
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
    *out = __s;
    space_local._4_4_ = buf._4_4_;
  }
  else {
    *out = space;
    space_local._4_4_ = buf._4_4_;
  }
  return space_local._4_4_;
}

Assistant:

int TemplateDictionary::StringAppendV(char* space, char** out,
                                      const char* format, va_list ap) {
  const int kBufsize = 1024;
  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, kBufsize, format, backup_ap);
  va_end(backup_ap);

  if ((result >= 0) && (result < kBufsize)) {
    *out = space;
    return result;  // It fit
  }

  // Repeatedly increase buffer size until it fits
  int length = kBufsize;
  while (true) {
    if (result < 0) {
      // Older snprintf() behavior. :-(  Just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "result+1" characters
      length = result+1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
    result = vsnprintf(buf, length, format, backup_ap);
    va_end(backup_ap);

    if ((result >= 0) && (result < length)) {
      *out = buf;
      return result;
    }
    delete[] buf;
  }
}